

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.h
# Opt level: O2

float haarY_improved(integral_image *iimage,int row,int col,int s)

{
  int rows;
  float fVar1;
  float fVar2;
  
  rows = s / 2;
  fVar1 = box_integral_improved(iimage,row,col - rows,rows,s);
  fVar2 = box_integral_improved(iimage,row - rows,col - rows,rows,s);
  return fVar1 - fVar2;
}

Assistant:

inline float haarY_improved(struct integral_image *iimage, int row, int col, int s) {
    return box_integral_improved(iimage, row, col-s/2, s/2, s) - box_integral_improved(iimage, row-s/2, col-s/2, s/2, s);
}